

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

target_ulong helper_divs_ppc64(CPUPPCState_conflict2 *env,target_ulong arg1,target_ulong arg2)

{
  int iVar1;
  uint uVar2;
  target_ulong arg2_local;
  target_ulong arg1_local;
  CPUPPCState_conflict2 *env_local;
  
  iVar1 = (int)arg2;
  if ((((int)arg1 == -0x80000000) && (iVar1 == -1)) || (iVar1 == 0)) {
    env->spr[0] = 0;
    env_local = (CPUPPCState_conflict2 *)0xffffffff80000000;
  }
  else {
    uVar2 = (int)arg1 >> 0x1f;
    env->spr[0] = (long)(int)((long)((ulong)uVar2 << 0x20 | arg1 & 0xffffffff) % (long)iVar1);
    env_local = (CPUPPCState_conflict2 *)
                (long)(int)((long)((ulong)uVar2 << 0x20 | arg1 & 0xffffffff) / (long)iVar1);
  }
  return (target_ulong)env_local;
}

Assistant:

target_ulong helper_divs(CPUPPCState *env, target_ulong arg1,
                         target_ulong arg2)
{
    if (((int32_t)arg1 == INT32_MIN && (int32_t)arg2 == (int32_t)-1) ||
        (int32_t)arg2 == 0) {
        env->spr[SPR_MQ] = 0;
        return INT32_MIN;
    } else {
        env->spr[SPR_MQ] = (int32_t)arg1 % (int32_t)arg2;
        return (int32_t)arg1 / (int32_t)arg2;
    }
}